

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

void __thiscall el::Configuration::~Configuration(Configuration *this)

{
  pointer pcVar1;
  
  (this->super_Loggable)._vptr_Loggable = (_func_int **)&PTR__Configuration_0012c1d0;
  pcVar1 = (this->m_value)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_value).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

virtual ~Configuration(void) {
  }